

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O3

void __thiscall QMenu::mousePressEvent(QMenu *this,QMouseEvent *e)

{
  QMenuPrivate *this_00;
  QWidgetData *pQVar1;
  Data *pDVar2;
  QWidget *this_01;
  long lVar3;
  bool bVar4;
  char cVar5;
  undefined4 uVar6;
  QAction *action;
  QPoint p;
  long in_FS_OFFSET;
  int iVar7;
  double extraout_XMM0_Qa;
  int iVar9;
  undefined1 auVar8 [16];
  double extraout_XMM1_Qa;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  QPoint local_48;
  QPoint local_40;
  QPoint local_38;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMenuPrivate **)&(this->super_QWidget).field_0x8;
  if ((this_00->field_0x421 & 1) != 0) goto LAB_0045cd49;
  bVar4 = QMenuPrivate::mouseEventTaken(this_00,e);
  if (bVar4) goto LAB_0045cd49;
  uVar6 = QEventPoint::position();
  auVar12._0_8_ =
       (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
       extraout_XMM1_Qa;
  auVar12._8_8_ =
       (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
       extraout_XMM0_Qa;
  auVar8 = maxpd(auVar12,_DAT_006605e0);
  iVar7 = (int)(double)(~-(ulong)(2147483647.0 < auVar12._0_8_) & auVar8._0_8_ |
                       -(ulong)(2147483647.0 < auVar12._0_8_) & 0x41dfffffffc00000);
  iVar9 = (int)(double)(~-(ulong)(2147483647.0 < auVar12._8_8_) & auVar8._8_8_ |
                       -(ulong)(2147483647.0 < auVar12._8_8_) & 0x41dfffffffc00000);
  auVar8._0_4_ = -(uint)(iVar7 == 0);
  auVar8._4_4_ = -(uint)(iVar7 == 0);
  auVar8._8_4_ = -(uint)(iVar9 == 0);
  auVar8._12_4_ = -(uint)(iVar9 == 0);
  iVar7 = movmskpd(uVar6,auVar8);
  if (iVar7 == 3) {
    auVar12 = QEventPoint::globalPosition();
    if ((((auVar12._0_8_ == 0.0) && (!NAN(auVar12._0_8_))) && (auVar12._8_8_ == 0.0)) &&
       (!NAN(auVar12._8_8_))) goto LAB_0045c99f;
  }
  else {
LAB_0045c99f:
    pQVar1 = (this->super_QWidget).data;
    local_30 = CONCAT44((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i,
                        (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i);
    local_38.xp.m_i = 0;
    local_38.yp.m_i = 0;
    auVar12 = QEventPoint::position();
    dVar10 = (double)((ulong)auVar12._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar12._0_8_;
    dVar11 = dVar10;
    if (dVar10 <= -2147483648.0) {
      dVar11 = -2147483648.0;
    }
    local_40.xp.m_i =
         (int)(double)(-(ulong)(2147483647.0 < dVar10) & 0x41dfffffffc00000 |
                      ~-(ulong)(2147483647.0 < dVar10) & (ulong)dVar11);
    dVar10 = (double)((ulong)auVar12._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar12._8_8_;
    dVar11 = dVar10;
    if (dVar10 <= -2147483648.0) {
      dVar11 = -2147483648.0;
    }
    local_40.yp.m_i =
         (int)(double)(-(ulong)(2147483647.0 < dVar10) & 0x41dfffffffc00000 |
                      ~-(ulong)(2147483647.0 < dVar10) & (ulong)dVar11);
    cVar5 = QRect::contains(&local_38,SUB81(&local_40,0));
    if (cVar5 != '\0') {
      auVar12 = QEventPoint::globalPosition();
      dVar10 = (double)((ulong)auVar12._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
               auVar12._0_8_;
      dVar11 = dVar10;
      if (dVar10 <= -2147483648.0) {
        dVar11 = -2147483648.0;
      }
      local_48.xp.m_i =
           (int)(double)(-(ulong)(2147483647.0 < dVar10) & 0x41dfffffffc00000 |
                        ~-(ulong)(2147483647.0 < dVar10) & (ulong)dVar11);
      dVar10 = (double)((ulong)auVar12._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
               auVar12._8_8_;
      dVar11 = dVar10;
      if (dVar10 <= -2147483648.0) {
        dVar11 = -2147483648.0;
      }
      local_48.yp.m_i =
           (int)(double)(-(ulong)(2147483647.0 < dVar10) & 0x41dfffffffc00000 |
                        ~-(ulong)(2147483647.0 < dVar10) & (ulong)dVar11);
      bVar4 = QMenuPrivate::hasMouseMoved(this_00,&local_48);
      if (bVar4) {
        QMenuPrivate::mouseDown = this;
        auVar12 = QEventPoint::position();
        dVar10 = (double)((ulong)auVar12._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                 auVar12._0_8_;
        dVar11 = dVar10;
        if (dVar10 <= -2147483648.0) {
          dVar11 = -2147483648.0;
        }
        p.xp.m_i = (int)(double)(-(ulong)(2147483647.0 < dVar10) & 0x41dfffffffc00000 |
                                ~-(ulong)(2147483647.0 < dVar10) & (ulong)dVar11);
        dVar10 = (double)((ulong)auVar12._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                 auVar12._8_8_;
        dVar11 = dVar10;
        if (dVar10 <= -2147483648.0) {
          dVar11 = -2147483648.0;
        }
        p.yp.m_i = (int)(double)(-(ulong)(2147483647.0 < dVar10) & 0x41dfffffffc00000 |
                                ~-(ulong)(2147483647.0 < dVar10) & (ulong)dVar11);
        action = QMenuPrivate::actionAt(this_00,p);
        QMenuPrivate::setCurrentAction(this_00,action,0x14,SelectedFromElsewhere,false);
        QWidget::update(&this->super_QWidget);
        goto LAB_0045cd49;
      }
    }
  }
  pDVar2 = (this_00->noReplayFor).wp.d;
  if (((pDVar2 != (Data *)0x0) && (*(int *)(pDVar2 + 4) != 0)) &&
     (this_01 = (QWidget *)(this_00->noReplayFor).wp.value, this_01 != (QWidget *)0x0)) {
    local_40.xp.m_i = 0;
    local_40.yp.m_i = 0;
    local_38 = QWidget::mapToGlobal(this_01,&local_40);
    lVar3 = *(long *)((this_00->noReplayFor).wp.value + 0x20);
    local_30 = CONCAT44((*(int *)(lVar3 + 0x20) + local_38.yp.m_i.m_i) - *(int *)(lVar3 + 0x18),
                        (*(int *)(lVar3 + 0x1c) + local_38.xp.m_i.m_i) - *(int *)(lVar3 + 0x14));
    auVar12 = QEventPoint::globalPosition();
    dVar10 = (double)((ulong)auVar12._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar12._0_8_;
    dVar11 = dVar10;
    if (dVar10 <= -2147483648.0) {
      dVar11 = -2147483648.0;
    }
    local_48.xp.m_i =
         (int)(double)(-(ulong)(2147483647.0 < dVar10) & 0x41dfffffffc00000 |
                      ~-(ulong)(2147483647.0 < dVar10) & (ulong)dVar11);
    dVar10 = (double)((ulong)auVar12._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar12._8_8_;
    dVar11 = dVar10;
    if (dVar10 <= -2147483648.0) {
      dVar11 = -2147483648.0;
    }
    local_48.yp.m_i =
         (int)(double)(-(ulong)(2147483647.0 < dVar10) & 0x41dfffffffc00000 |
                      ~-(ulong)(2147483647.0 < dVar10) & (ulong)dVar11);
    cVar5 = QRect::contains(&local_38,SUB81(&local_48,0));
    if (cVar5 != '\0') {
      QWidget::setAttribute(&this->super_QWidget,WA_NoMouseReplay,true);
    }
  }
  if (this_00->eventLoop != (QEventLoop *)0x0) {
    pDVar2 = (this_00->syncAction).wp.d;
    (this_00->syncAction).wp.d = (Data *)0x0;
    (this_00->syncAction).wp.value = (QObject *)0x0;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar2 = *(int *)pDVar2 + -1;
      UNLOCK();
      if (*(int *)pDVar2 == 0) {
        operator_delete(pDVar2);
      }
    }
  }
  QMenuPrivate::hideUpToMenuBar(this_00);
LAB_0045cd49:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenu::mousePressEvent(QMouseEvent *e)
{
    Q_D(QMenu);
    if (d->aboutToHide || d->mouseEventTaken(e))
        return;
    // Workaround for XCB on multiple screens which doesn't have offset. If the menu is open on one screen
    // and mouse clicks on second screen, e->pos() is QPoint(0,0) and the menu doesn't hide. This trick makes
    // possible to hide the menu when mouse clicks on another screen (e->screenPos() returns correct value).
    // Only when mouse clicks in QPoint(0,0) on second screen, the menu doesn't hide.
    if ((e->position().toPoint().isNull() && !e->globalPosition().isNull())
        || !rect().contains(e->position().toPoint())
        || !d->hasMouseMoved(e->globalPosition().toPoint())) {
         if (d->noReplayFor
             && QRect(d->noReplayFor->mapToGlobal(QPoint()), d->noReplayFor->size()).contains(e->globalPosition().toPoint()))
             setAttribute(Qt::WA_NoMouseReplay);
         if (d->eventLoop) // synchronous operation
             d->syncAction = nullptr;
        d->hideUpToMenuBar();
        return;
    }
    QMenuPrivate::mouseDown = this;

    QAction *action = d->actionAt(e->position().toPoint());
    d->setCurrentAction(action, 20);
    update();
}